

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
::disposeImpl(WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
              *this)

{
  void *in_RSI;
  
  WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  ::disposeImpl((WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
                 *)(this + -8),in_RSI);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    // TODO(perf): Factor some of this out so it isn't regenerated for every fulfiller type?

    if (inner == nullptr) {
      // Already detached.
      delete this;
    } else {
      if (inner->isWaiting()) {
        inner->reject(kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__,
            kj::heapString("PromiseFulfiller was destroyed without fulfilling the promise.")));
      }
      inner = nullptr;
    }
  }